

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

undefined8 duckdb_apache::thrift::to_string<bool>(vector<bool,_true> *t)

{
  ostream *poVar1;
  undefined8 in_RDI;
  ostringstream o;
  string local_1b8 [48];
  ostringstream local_188 [312];
  _Bit_const_iterator *in_stack_ffffffffffffffb0;
  _Bit_const_iterator *in_stack_ffffffffffffffb8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"[");
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0x725d3b);
  std::vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)0x725d63);
  to_string<std::_Bit_const_iterator>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  poVar1 = std::operator<<(poVar1,local_1b8);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}